

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XarExecFuse.cpp
# Opt level: O3

void anon_unknown.dwarf_5aee::check_file_sanity(string *path,Expectation expected,mode_t perms)

{
  bool bVar1;
  int iVar2;
  __uid_t _Var3;
  __gid_t _Var4;
  ostream *poVar5;
  int *piVar6;
  char *pcVar7;
  stat st;
  undefined1 auStack_238 [392];
  stat local_b0;
  
  iVar2 = stat((path->_M_dataplus)._M_p,&local_b0);
  if (iVar2 == 0) {
    _Var3 = geteuid();
    if (local_b0.st_uid == _Var3) {
      _Var4 = getegid();
      if (local_b0.st_gid != _Var4) {
        bVar1 = tools::xar::is_user_in_group(local_b0.st_gid);
        if (!bVar1) {
          memset(auStack_238,0,0x188);
          std::__cxx11::stringstream::stringstream((stringstream *)auStack_238);
          poVar5 = (ostream *)(auStack_238 + 0x10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"FATAL ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,
                     "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                     ,0x5d);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x5e);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Invalid group of ",0x11);
          std::operator<<(poVar5,(string *)path);
          goto LAB_00106e59;
        }
      }
      if (expected == File) {
        if ((local_b0.st_mode & 0xf000) != 0x8000) {
          memset(auStack_238,0,0x188);
          std::__cxx11::stringstream::stringstream((stringstream *)auStack_238);
          poVar5 = (ostream *)(auStack_238 + 0x10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"FATAL ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,
                     "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                     ,0x5d);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x65);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"Should be a normal file: ",0x19);
          std::operator<<(poVar5,(string *)path);
          goto LAB_00106e59;
        }
      }
      else if ((expected == Directory) && ((local_b0.st_mode & 0xf000) != 0x4000)) {
        memset(auStack_238,0,0x188);
        std::__cxx11::stringstream::stringstream((stringstream *)auStack_238);
        poVar5 = (ostream *)(auStack_238 + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"FATAL ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                   ,0x5d);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x62);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Should be a directory: ",0x17);
        std::operator<<(poVar5,(string *)path);
        goto LAB_00106e59;
      }
      if ((local_b0.st_mode & 0xfff) == perms) {
        return;
      }
      memset(auStack_238,0,0x188);
      std::__cxx11::stringstream::stringstream((stringstream *)auStack_238);
      poVar5 = (ostream *)(auStack_238 + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"FATAL ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,
                 "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                 ,0x5d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x68);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Invalid permissions on ",0x17);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(path->_M_dataplus)._M_p,path->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", expected ",0xb);
      *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 0x40;
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", got ",6);
      std::ostream::operator<<(poVar5,local_b0.st_mode & 0xfff);
    }
    else {
      memset(auStack_238,0,0x188);
      std::__cxx11::stringstream::stringstream((stringstream *)auStack_238);
      poVar5 = (ostream *)(auStack_238 + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"FATAL ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,
                 "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                 ,0x5d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x59);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Invalid owner of ",0x11);
      std::operator<<(poVar5,(string *)path);
    }
  }
  else {
    memset(auStack_238,0,0x188);
    std::__cxx11::stringstream::stringstream((stringstream *)auStack_238);
    poVar5 = (ostream *)(auStack_238 + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"FATAL ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,
               "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
               ,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"stat(path.c_str(), &st) == 0",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    std::operator<<(poVar5,pcVar7);
  }
LAB_00106e59:
  tools::xar::detail::LogFatal::~LogFatal((LogFatal *)auStack_238);
}

Assistant:

void check_file_sanity(
    const std::string& path,
    enum Expectation expected,
    mode_t perms) {
  struct stat st;
  XAR_PCHECK_SIMPLE(stat(path.c_str(), &st) == 0);
  if (st.st_uid != geteuid()) {
    XAR_FATAL << "Invalid owner of " << path;
  }

  // Verify the directory is owned by one of the groups the user is in.
  if (st.st_gid != getegid() && !tools::xar::is_user_in_group(st.st_gid)) {
    XAR_FATAL << "Invalid group of " << path;
  }

  if (expected == Expectation::Directory && !S_ISDIR(st.st_mode)) {
    XAR_FATAL << "Should be a directory: " << path;
  }
  if (expected == Expectation::File && !S_ISREG(st.st_mode)) {
    XAR_FATAL << "Should be a normal file: " << path;
  }
  if ((st.st_mode & 07777) != perms) {
    XAR_FATAL << "Invalid permissions on " << path << ", expected " << std::oct
              << perms << ", got " << (st.st_mode & 07777);
  }
}